

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O0

bool __thiscall neueda::cdrItem::asString(cdrItem *this,string *value)

{
  size_type sVar1;
  string *in_RSI;
  long in_RDI;
  char tmp [256];
  char local_128 [264];
  string *local_20;
  bool local_9;
  
  local_20 = in_RSI;
  switch(*(undefined4 *)(in_RDI + 0x10)) {
  case 0:
    std::__cxx11::string::assign(in_RSI);
    local_9 = true;
    break;
  case 1:
    snprintf(local_128,0x100,"%f",*(undefined8 *)(in_RDI + 0x38));
    std::__cxx11::string::assign((char *)local_20);
    local_9 = true;
    break;
  case 2:
    snprintf(local_128,0x100,"%lld",*(undefined8 *)(in_RDI + 0x40));
    std::__cxx11::string::assign((char *)local_20);
    local_9 = true;
    break;
  case 3:
    snprintf(local_128,0x100,"%04u-%02u-%02u %02u:%02u:%02u.%04u",(ulong)*(uint *)(in_RDI + 0x60),
             (ulong)*(uint *)(in_RDI + 0x5c),(ulong)*(uint *)(in_RDI + 0x58),
             *(undefined4 *)(in_RDI + 0x48),*(undefined4 *)(in_RDI + 0x4c),
             *(undefined4 *)(in_RDI + 0x50),*(undefined4 *)(in_RDI + 0x54));
    std::__cxx11::string::assign((char *)local_20);
    local_9 = true;
    break;
  case 4:
    sVar1 = std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>::size
                      ((vector<neueda::cdr,_std::allocator<neueda::cdr>_> *)(in_RDI + 0x68));
    snprintf(local_128,0x100,"<array of %zu>",sVar1);
    std::__cxx11::string::assign((char *)local_20);
    local_9 = true;
    break;
  default:
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool
cdrItem::asString (string& value) const
{
    char tmp[256];
    switch (mType)
    {
    case CDR_STRING:
        value.assign (mString);
        return true;
    case CDR_DOUBLE:
        snprintf (tmp, sizeof tmp, "%f", mDouble);
        value.assign (tmp);
        return true;
    case CDR_INTEGER:
        snprintf (tmp, sizeof tmp, "%lld", (long long)mInteger);
        value.assign (tmp);
        return true;
    case CDR_DATETIME:
        snprintf (tmp,
                  sizeof tmp,
                  "%04u-%02u-%02u %02u:%02u:%02u.%04u",
                  mDateTime.mYear,
                  mDateTime.mMonth,
                  mDateTime.mDay,
                  mDateTime.mHour,
                  mDateTime.mMinute,
                  mDateTime.mSecond,
                  mDateTime.mNanosecond);
        value.assign (tmp);
        return true;
    case CDR_ARRAY:
        snprintf (tmp, sizeof tmp, "<array of %zu>", mArray.size ());
        value.assign (tmp);
        return true;
    default:
        return false;
    }
}